

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

VarPackedStruct * __thiscall
kratos::Generator::var_packed
          (Generator *this,string *var_name,shared_ptr<kratos::PackedStruct> *packed_struct_,
          uint32_t size)

{
  initializer_list<unsigned_int> __l;
  VarPackedStruct *pVVar1;
  allocator<unsigned_int> local_55;
  uint32_t local_54;
  iterator local_50;
  size_type local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  uint32_t local_24;
  shared_ptr<kratos::PackedStruct> *psStack_20;
  uint32_t size_local;
  shared_ptr<kratos::PackedStruct> *packed_struct__local;
  string *var_name_local;
  Generator *this_local;
  
  local_50 = &local_54;
  local_48 = 1;
  local_54 = size;
  local_24 = size;
  psStack_20 = packed_struct_;
  packed_struct__local = (shared_ptr<kratos::PackedStruct> *)var_name;
  var_name_local = (string *)this;
  std::allocator<unsigned_int>::allocator(&local_55);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40,__l,&local_55);
  pVVar1 = var_packed(this,var_name,packed_struct_,&local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_40);
  std::allocator<unsigned_int>::~allocator(&local_55);
  return pVVar1;
}

Assistant:

VarPackedStruct &Generator::var_packed(const std::string &var_name,
                                       const std::shared_ptr<PackedStruct> &packed_struct_,
                                       uint32_t size) {
    return var_packed(var_name, packed_struct_, std::vector<uint32_t>{size});
}